

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_ast.h
# Opt level: O1

void __thiscall lambda::Parse_ast::Call::Call(Call *this,Parse_ast *callee,Parse_ast *argument)

{
  _Head_base<0UL,_lambda::Parse_ast_*,_false> this_00;
  _Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  *this_01;
  
  this_00._M_head_impl = (Parse_ast *)operator_new(0x30);
  std::__detail::__variant::
  _Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  ::_Move_ctor_base((_Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                     *)this_00._M_head_impl,
                    (_Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                     *)callee);
  (this->callee_)._M_t.
  super___uniq_ptr_impl<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>._M_t.
  super__Tuple_impl<0UL,_lambda::Parse_ast_*,_std::default_delete<lambda::Parse_ast>_>.
  super__Head_base<0UL,_lambda::Parse_ast_*,_false>._M_head_impl = this_00._M_head_impl;
  this_01 = (_Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
             *)operator_new(0x30);
  std::__detail::__variant::
  _Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  ::_Move_ctor_base(this_01,(_Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                             *)argument);
  (this->argument_)._M_t.
  super___uniq_ptr_impl<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>._M_t.
  super__Tuple_impl<0UL,_lambda::Parse_ast_*,_std::default_delete<lambda::Parse_ast>_>.
  super__Head_base<0UL,_lambda::Parse_ast_*,_false>._M_head_impl = (Parse_ast *)this_01;
  return;
}

Assistant:

explicit Call(Parse_ast callee, Parse_ast argument)
        : callee_(std::make_unique<Parse_ast>(std::move(callee))),
          argument_(std::make_unique<Parse_ast>(std::move(argument))) {}